

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPLayer.cpp
# Opt level: O0

void __thiscall TCPLayer::notifyRead(TCPLayer *this)

{
  PacketHandler *pPVar1;
  int iVar2;
  uint32_t uVar3;
  char *pcVar4;
  Buffer local_450;
  char local_431;
  int local_430;
  int iStack_42c;
  char c;
  int readBytes_1;
  int howManyBytesCanBeRead_1;
  int size;
  char sizeBytes [4];
  int readBytes;
  int howManyBytesCanBeRead;
  char incomingData [1024];
  TCPLayer *this_local;
  
  memset(&readBytes,0,0x400);
  if ((this->gotSize & 1U) == 0) {
    iVar2 = Buffer::getSize(&this->incomingPacket);
    sizeBytes = (char  [4])(4 - iVar2);
    size = TCPSocket::receive(&this->socket,(char *)&readBytes,(int)sizeBytes);
    Buffer::append(&this->incomingPacket,(char *)&readBytes,(long)size);
    iVar2 = Buffer::getSize(&this->incomingPacket);
    if (iVar2 == 4) {
      memset(&howManyBytesCanBeRead_1,0,4);
      pcVar4 = Buffer::getData(&this->incomingPacket);
      howManyBytesCanBeRead_1 = CONCAT31(howManyBytesCanBeRead_1._1_3_,*pcVar4);
      pcVar4 = Buffer::getData(&this->incomingPacket);
      howManyBytesCanBeRead_1._0_2_ = CONCAT11(pcVar4[1],(undefined1)howManyBytesCanBeRead_1);
      pcVar4 = Buffer::getData(&this->incomingPacket);
      howManyBytesCanBeRead_1._0_3_ = CONCAT12(pcVar4[2],(undefined2)howManyBytesCanBeRead_1);
      pcVar4 = Buffer::getData(&this->incomingPacket);
      howManyBytesCanBeRead_1 = CONCAT13(pcVar4[3],(undefined3)howManyBytesCanBeRead_1);
      readBytes_1 = howManyBytesCanBeRead_1;
      uVar3 = ntohl(howManyBytesCanBeRead_1);
      this->incomingPacketSize = uVar3;
      Buffer::consume(&this->incomingPacket,4);
      this->gotSize = true;
    }
  }
  else {
    iVar2 = this->incomingPacketSize;
    iStack_42c = Buffer::getSize(&this->incomingPacket);
    iStack_42c = iVar2 - iStack_42c;
    if (0x400 < iStack_42c) {
      iStack_42c = 0x400;
    }
    local_430 = TCPSocket::receive(&this->socket,(char *)&readBytes,iStack_42c);
    Buffer::append(&this->incomingPacket,(char *)&readBytes,(long)local_430);
    this->incomingPacketSize = this->incomingPacketSize - local_430;
    if (this->incomingPacketSize == 0) {
      local_431 = '\0';
      Buffer::append(&this->incomingPacket,&local_431,1);
      this->incomingPacketSize = 0;
      this->gotSize = false;
      pPVar1 = this->upperLayer;
      Buffer::Buffer(&local_450,&this->incomingPacket);
      (**pPVar1->_vptr_PacketHandler)(pPVar1,&local_450);
      Buffer::~Buffer(&local_450);
      iVar2 = Buffer::getSize(&this->incomingPacket);
      Buffer::consume(&this->incomingPacket,(long)iVar2);
    }
  }
  return;
}

Assistant:

void TCPLayer::notifyRead() {
    char incomingData[1024] = {0};


    if(!gotSize){
        int howManyBytesCanBeRead = sizeof(int) - incomingPacket.getSize();

        int readBytes = socket.receive(incomingData, howManyBytesCanBeRead);

        incomingPacket.append(incomingData, readBytes);

        if(incomingPacket.getSize() == sizeof(int)){
            char sizeBytes[sizeof(int)] = {0};
            sizeBytes[0] = incomingPacket.getData()[0];
            sizeBytes[1] = incomingPacket.getData()[1];
            sizeBytes[2] = incomingPacket.getData()[2];
            sizeBytes[3] = incomingPacket.getData()[3];

            int size = *(reinterpret_cast<int*>(sizeBytes));

            incomingPacketSize = ntohl(size);

            incomingPacket.consume(sizeof(int));
            gotSize = true;
        }
    }
    else{
        int howManyBytesCanBeRead = incomingPacketSize - incomingPacket.getSize();
        if(howManyBytesCanBeRead > 1024){
            howManyBytesCanBeRead = 1024;
        }

        int readBytes = socket.receive(incomingData, howManyBytesCanBeRead);

        incomingPacket.append(incomingData, readBytes);
        incomingPacketSize -= readBytes;

        if(incomingPacketSize == 0){
            char c = 0;
            incomingPacket.append(&c, 1);

            incomingPacketSize = 0;
            gotSize = false;

            upperLayer->handlePacket(incomingPacket);
            incomingPacket.consume(incomingPacket.getSize());
        }
    }

}